

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsExecutionServer.cpp
# Opt level: O2

ssize_t __thiscall
xs::MessageBuilder::read(MessageBuilder *this,int __fd,void *__buf,size_t __nbytes)

{
  uchar uVar1;
  int iVar2;
  undefined8 in_RAX;
  ulong uVar3;
  pointer puVar4;
  ulong extraout_RAX;
  int count;
  undefined4 in_register_00000034;
  RingBuffer<unsigned_char> *this_00;
  pointer data;
  undefined8 uStack_28;
  
  this_00 = (RingBuffer<unsigned_char> *)CONCAT44(in_register_00000034,__fd);
  data = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  puVar4 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (long)puVar4 - (long)data;
  uStack_28 = in_RAX;
  if (uVar3 < 8) {
    while (uVar3 = (long)puVar4 - (long)data, uVar3 < 8) {
      if (this_00->m_numElements < 1) {
        return uVar3;
      }
      uVar1 = de::RingBuffer<unsigned_char>::popBack(this_00);
      uStack_28 = CONCAT17(uVar1,(undefined7)uStack_28);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&this->m_buffer,(uchar *)((long)&uStack_28 + 7));
      data = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
      puVar4 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    if (uVar3 == 8) {
      Message::parseHeader(data,8,&this->m_messageType,&this->m_messageSize);
      uVar3 = (long)(this->m_buffer).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_buffer).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar3 < 8) {
        return uVar3;
      }
    }
  }
  iVar2 = (int)uVar3;
  count = (int)this->m_messageSize - iVar2;
  if (this_00->m_numElements < count) {
    count = this_00->m_numElements;
  }
  if (count != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->m_buffer,(long)count + (long)iVar2);
    de::RingBuffer<unsigned_char>::popBack
              (this_00,(this->m_buffer).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + iVar2,count);
    uVar3 = extraout_RAX;
  }
  return uVar3;
}

Assistant:

void MessageBuilder::read (ByteBuffer& src)
{
	// Try to get header.
	if (m_buffer.size() < MESSAGE_HEADER_SIZE)
	{
		while (m_buffer.size() < MESSAGE_HEADER_SIZE &&
			   src.getNumElements() > 0)
			m_buffer.push_back(src.popBack());

		DE_ASSERT(m_buffer.size() <= MESSAGE_HEADER_SIZE);

		if (m_buffer.size() == MESSAGE_HEADER_SIZE)
		{
			// Got whole header, parse it.
			Message::parseHeader(&m_buffer[0], (int)m_buffer.size(), m_messageType, m_messageSize);
		}
	}

	if (m_buffer.size() >= MESSAGE_HEADER_SIZE)
	{
		// We have header.
		size_t msgSize			= getMessageSize();
		size_t numBytesLeft		= msgSize - m_buffer.size();
		size_t numToRead		= (size_t)de::min(src.getNumElements(), (int)numBytesLeft);

		if (numToRead > 0)
		{
			int curBufPos = (int)m_buffer.size();
			m_buffer.resize(curBufPos+numToRead);
			src.popBack(&m_buffer[curBufPos], (int)numToRead);
		}
	}
}